

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

int xercesc_4_0::XMLDateTime::compareResult
              (XMLDateTime *pDate1,XMLDateTime *pDate2,bool set2Left,int utc_type)

{
  int local_b0;
  XMLDateTime *local_a0;
  undefined1 local_88 [8];
  XMLDateTime tmpDate;
  int utc_type_local;
  bool set2Left_local;
  XMLDateTime *pDate2_local;
  XMLDateTime *pDate1_local;
  
  local_a0 = pDate2;
  if (set2Left) {
    local_a0 = pDate1;
  }
  tmpDate.fMemoryManager._0_4_ = utc_type;
  tmpDate.fMemoryManager._7_1_ = set2Left;
  XMLDateTime((XMLDateTime *)local_88,local_a0);
  tmpDate.fValue[6] = 0xe;
  tmpDate.fValue[7] = 0;
  tmpDate.fValue[5] = (int)tmpDate.fMemoryManager;
  normalize((XMLDateTime *)local_88);
  if ((tmpDate.fMemoryManager._7_1_ & 1) == 0) {
    local_b0 = compareOrder(pDate1,(XMLDateTime *)local_88);
  }
  else {
    local_b0 = compareOrder((XMLDateTime *)local_88,pDate2);
  }
  ~XMLDateTime((XMLDateTime *)local_88);
  return local_b0;
}

Assistant:

int XMLDateTime::compareResult(const XMLDateTime* const pDate1
                             , const XMLDateTime* const pDate2
                             , bool  set2Left
                             , int   utc_type)
{
    XMLDateTime tmpDate = (set2Left ? *pDate1 : *pDate2);

    tmpDate.fTimeZone[hh] = 14;
    tmpDate.fTimeZone[mm] = 0;
    tmpDate.fValue[utc] = utc_type;
    tmpDate.normalize();

    return (set2Left? XMLDateTime::compareOrder(&tmpDate, pDate2) :
                      XMLDateTime::compareOrder(pDate1, &tmpDate));
}